

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall i2i::format<8,12>(i2i *this,context *ctx,token *token,opcode *op)

{
  undefined8 this_00;
  bool bVar1;
  long *plVar2;
  optional<unsigned_long> oVar3;
  token local_a0;
  string_view local_78;
  _Storage<unsigned_long,_true> local_68;
  undefined1 local_60;
  string_view local_58;
  _Storage<unsigned_long,_true> local_48;
  undefined1 local_40;
  undefined1 local_38 [8];
  optional<long> result;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
       = op;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,".");
  oVar3 = find_in_table(token,format<8,_12>::table_unsigned,local_58);
  local_48._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  std::optional<long>::optional<unsigned_long,_true>
            ((optional<long> *)local_38,(optional<unsigned_long> *)&local_48);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_38);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,".");
    oVar3 = find_in_table(token,format<8,_12>::table_signed,local_78);
    local_68._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_60 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional<long>::operator=((optional<long> *)local_38,(optional<unsigned_long> *)&local_68);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_38);
    if (!bVar1) {
      fail((token *)this,(char *)token,"expected .U8, .U16, .U32, .S8, .S16 or .S32");
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)this;
    }
    opcode::add_bits((opcode *)
                     result.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._8_8_,0x1000);
  }
  this_00 = result.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_;
  plVar2 = std::optional<long>::operator*((optional<long> *)local_38);
  opcode::add_bits((opcode *)this_00,*plVar2 << 8);
  context::tokenize(&local_a0,ctx);
  memcpy(token,&local_a0,0x24);
  memset(this,0,8);
  error::error((error *)this);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(format)
    {
        static const char* table_unsigned[] = {"U8", "U16", "U32", nullptr};
        static const char* table_signed[] = {"S8", "S16", "S32", nullptr};

        std::optional<int64_t> result = find_in_table(token, table_unsigned, ".");
        if (!result) {
            result = find_in_table(token, table_signed, ".");
            if (!result) {
                return fail(token, "expected .U8, .U16, .U32, .S8, .S16 or .S32");
            }
            op.add_bits(1ULL << sign_address);
        }
        op.add_bits(*result << address);
        token = ctx.tokenize();
        return {};
    }